

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

void shim_vkGetDeviceQueue
               (VkDevice device,uint32_t queueFamilyIndex,uint32_t queueIndex,VkQueue *pQueue)

{
  pointer pPVar1;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_> _Var2;
  pointer pPVar3;
  VkDevice device_local;
  
  pPVar1 = mock.physical_devices_details.
           super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar3 = mock.physical_devices_details.
           super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
           ._M_impl.super__Vector_impl_data._M_start;
  device_local = device;
  while( true ) {
    if (pPVar3 == pPVar1) {
      return;
    }
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<VkDevice_T**,std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>,__gnu_cxx::__ops::_Iter_equals_val<VkDevice_T*const>>
                      (*(undefined8 *)&pPVar3->created_device_handles,
                       *(undefined8 *)&pPVar3->field_0x670,&device_local);
    if (((_Var2._M_current != *(VkDevice_T ***)&pPVar3->field_0x670) &&
        ((ulong)queueFamilyIndex <
         (ulong)((*(long *)&pPVar3->field_0x640 - *(long *)&pPVar3->queue_family_properties) / 0x18)
        )) && (queueIndex <
               *(uint *)(*(long *)&pPVar3->queue_family_properties + 4 +
                        (ulong)queueFamilyIndex * 0x18))) break;
    pPVar3 = pPVar3 + 1;
  }
  *pQueue = (VkQueue)(ulong)(queueIndex + 0xccee);
  return;
}

Assistant:

VKAPI_ATTR void VKAPI_CALL shim_vkGetDeviceQueue(VkDevice device, uint32_t queueFamilyIndex, uint32_t queueIndex, VkQueue* pQueue) {
    for (auto& physical_devices : mock.physical_devices_details) {
        auto it = std::find(
            std::begin(physical_devices.created_device_handles), std::end(physical_devices.created_device_handles), device);
        if (it != std::end(physical_devices.created_device_handles)) {
            if (queueFamilyIndex < physical_devices.queue_family_properties.size() &&
                queueIndex < physical_devices.queue_family_properties[queueFamilyIndex].queueCount) {
                *pQueue = get_handle<VkQueue>(0x0000CCEEU + queueIndex);
                return;
            }
        }
    }
}